

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

MemoryAccessMask __thiscall
spv::Builder::sanitizeMemoryAccessForStorageClass
          (Builder *this,MemoryAccessMask memoryAccess,StorageClass sc)

{
  MemoryAccessMask MVar1;
  MemoryAccessMask local_14;
  StorageClass sc_local;
  MemoryAccessMask memoryAccess_local;
  Builder *this_local;
  
  local_14 = memoryAccess;
  if ((((sc != StorageClassUniform) && (sc != StorageClassWorkgroup)) && (sc != StorageBuffer)) &&
     (sc != PhysicalStorageBuffer)) {
    MVar1 = spv::operator|(MakePointerAvailable,MakePointerVisible);
    MVar1 = spv::operator|(MVar1,MemoryAccessNonPrivatePointerKHRMask);
    MVar1 = operator~(MVar1);
    local_14 = spv::operator&(memoryAccess,MVar1);
  }
  return local_14;
}

Assistant:

spv::MemoryAccessMask Builder::sanitizeMemoryAccessForStorageClass(spv::MemoryAccessMask memoryAccess, StorageClass sc)
    const
{
    switch (sc) {
    case spv::StorageClassUniform:
    case spv::StorageClassWorkgroup:
    case spv::StorageClassStorageBuffer:
    case spv::StorageClassPhysicalStorageBufferEXT:
        break;
    default:
        memoryAccess = spv::MemoryAccessMask(memoryAccess &
                        ~(spv::MemoryAccessMakePointerAvailableKHRMask |
                          spv::MemoryAccessMakePointerVisibleKHRMask |
                          spv::MemoryAccessNonPrivatePointerKHRMask));
        break;
    }
    return memoryAccess;
}